

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poisson_dist.hpp
# Opt level: O0

void __thiscall trng::poisson_dist::param_type::calc_probabilities(param_type *this)

{
  bool bVar1;
  vector<double,_std::allocator<double>_> *in_RDI;
  int x;
  value_type_conflict6 *in_stack_ffffffffffffffa8;
  pointer *in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  int local_24;
  undefined1 local_20 [32];
  
  memset(local_20,0,0x18);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x38ff9e);
  std::vector<double,_std::allocator<double>_>::operator=
            (in_RDI,(vector<double,_std::allocator<double>_> *)
                    CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  std::vector<double,_std::allocator<double>_>::~vector(in_RDI);
  local_24 = 0;
  while( true ) {
    bVar1 = true;
    if (6 < local_24) {
      bVar1 = (double)local_24 <
              (double)(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start * 2.0;
    }
    if (!bVar1) break;
    in_stack_ffffffffffffffb0 =
         &(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish;
    math::GammaQ((double)in_stack_ffffffffffffffb0,(double)in_stack_ffffffffffffffa8);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffa8);
    local_24 = local_24 + 1;
  }
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8);
  return;
}

Assistant:

void calc_probabilities() {
        P_ = std::vector<double>();
        int x = 0;
        while (x < 7 or x < 2 * mu_) {
          P_.push_back(math::GammaQ(x + 1.0, mu_));
          ++x;
        }
        P_.push_back(1);
      }